

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_lib.c
# Opt level: O0

int bio_write_intern(BIO *b,void *data,size_t dlen,size_t *written)

{
  long lVar1;
  undefined8 *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  long in_stack_00000010;
  int ret;
  size_t local_written;
  char *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (in_RCX != (undefined8 *)0x0) {
    *in_RCX = 0;
  }
  if (in_RDI == 0) {
    iVar2 = 0;
  }
  else if ((*(long *)(in_RDI + 8) == 0) || (*(long *)(*(long *)(in_RDI + 8) + 0x10) == 0)) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    ERR_set_error(0x20,0x79,(char *)0x0);
    iVar2 = -2;
  }
  else {
    if ((*(long *)(in_RDI + 0x10) != 0) || (*(long *)(in_RDI + 0x18) != 0)) {
      in_stack_ffffffffffffffc0 = (char *)0x0;
      lVar1 = bio_call_callback((BIO *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                ,(int)((ulong)in_RDI >> 0x20),in_RSI,in_RDX,
                                (int)((ulong)in_RCX >> 0x20),(long)in_stack_ffffffffffffffd0,
                                in_stack_00000010,(size_t *)local_written);
      in_stack_ffffffffffffffcc = (int)lVar1;
      if (in_stack_ffffffffffffffcc < 1) {
        return in_stack_ffffffffffffffcc;
      }
    }
    if (*(int *)(in_RDI + 0x28) == 0) {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
      ERR_set_error(0x20,0x78,(char *)0x0);
      iVar2 = -1;
    }
    else {
      iVar2 = (**(code **)(*(long *)(in_RDI + 8) + 0x10))
                        (in_RDI,in_RSI,in_RDX,&stack0xffffffffffffffd0);
      if (0 < iVar2) {
        *(char **)(in_RDI + 0x68) = in_stack_ffffffffffffffd0 + *(long *)(in_RDI + 0x68);
      }
      if ((*(long *)(in_RDI + 0x10) != 0) || (*(long *)(in_RDI + 0x18) != 0)) {
        lVar1 = bio_call_callback((BIO *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),
                                  (int)((ulong)in_RDI >> 0x20),in_RSI,in_RDX,
                                  (int)((ulong)in_RCX >> 0x20),(long)in_stack_ffffffffffffffd0,
                                  in_stack_00000010,(size_t *)local_written);
        iVar2 = (int)lVar1;
      }
      if (in_RCX != (undefined8 *)0x0) {
        *in_RCX = in_stack_ffffffffffffffd0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int bio_write_intern(BIO *b, const void *data, size_t dlen,
                            size_t *written)
{
    size_t local_written;
    int ret;

    if (written != NULL)
        *written = 0;
    /*
     * b == NULL is not an error but just means that zero bytes are written.
     * Do not raise an error here.
     */
    if (b == NULL)
        return 0;

    if (b->method == NULL || b->method->bwrite == NULL) {
        ERR_raise(ERR_LIB_BIO, BIO_R_UNSUPPORTED_METHOD);
        return -2;
    }

    if (HAS_CALLBACK(b) &&
        ((ret = (int)bio_call_callback(b, BIO_CB_WRITE, data, dlen, 0, 0L, 1L,
                                       NULL)) <= 0))
        return ret;

    if (!b->init) {
        ERR_raise(ERR_LIB_BIO, BIO_R_UNINITIALIZED);
        return -1;
    }

    ret = b->method->bwrite(b, data, dlen, &local_written);

    if (ret > 0)
        b->num_write += (uint64_t)local_written;

    if (HAS_CALLBACK(b))
        ret = (int)bio_call_callback(b, BIO_CB_WRITE | BIO_CB_RETURN, data,
                                     dlen, 0, 0L, ret, &local_written);

    if (written != NULL)
        *written = local_written;
    return ret;
}